

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O0

shared_ptr<MovementSystem> __thiscall
entityx::SystemManager::system<MovementSystem>(SystemManager *this)

{
  bool bVar1;
  shared_ptr<entityx::BaseSystem> *__r;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<MovementSystem> sVar3;
  iterator it;
  element_type *this_00;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_false>
  local_28;
  Family local_20;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_false>
  local_18 [3];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  __r = (shared_ptr<entityx::BaseSystem> *)(in_RSI + 0x18);
  this_00 = in_RDI;
  local_20 = System<MovementSystem>::family();
  local_18[0]._M_cur =
       (__node_type *)
       Catch::clara::std::
       unordered_map<unsigned_long,_std::shared_ptr<entityx::BaseSystem>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>_>_>
       ::find((unordered_map<unsigned_long,_std::shared_ptr<entityx::BaseSystem>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>_>_>
               *)this_00,(key_type *)0x2aa306);
  local_28._M_cur =
       (__node_type *)
       Catch::clara::std::
       unordered_map<unsigned_long,_std::shared_ptr<entityx::BaseSystem>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>_>_>
       ::end((unordered_map<unsigned_long,_std::shared_ptr<entityx::BaseSystem>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>_>_>
              *)this_00);
  bVar1 = Catch::clara::std::__detail::operator==(local_18,&local_28);
  if (bVar1) {
    Catch::clara::std::shared_ptr<MovementSystem>::shared_ptr
              ((shared_ptr<MovementSystem> *)0x2aa33c);
    _Var2._M_pi = extraout_RDX;
  }
  else {
    Catch::clara::std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_false,_false>
    ::operator->((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<entityx::BaseSystem>_>,_false,_false>
                  *)0x2aa348);
    sVar3 = std::static_pointer_cast<MovementSystem,entityx::BaseSystem>(__r);
    _Var2 = sVar3.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  sVar3.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<MovementSystem>)
         sVar3.super___shared_ptr<MovementSystem,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<S> system() {
    auto it = systems_.find(S::family());
    assert(it != systems_.end());
    return it == systems_.end()
        ? std::shared_ptr<S>()
        : std::shared_ptr<S>(std::static_pointer_cast<S>(it->second));
  }